

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioSerialRead(uint gpio,void *buf,size_t bufSize)

{
  FILE *pFVar1;
  char *pcVar2;
  ulong in_RDX;
  void *in_RSI;
  uint in_EDI;
  wfRx_t *w;
  uint wpos;
  uint bytes;
  uint local_1c;
  uint local_4;
  
  pFVar1 = _stderr;
  local_1c = 0;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: gpio=%d buf=%08X bufSize=%d\n",pcVar2,"gpioSerialRead",(ulong)in_EDI,
            (ulong)in_RSI & 0xffffffff,in_RDX);
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,"gpioSerialRead")
      ;
    }
    local_4 = 0xffffffe1;
  }
  else if (in_EDI < 0x20) {
    if (in_RDX == 0) {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar2 = myTimeStamp();
        fprintf(pFVar1,"%s %s: buffer size can\'t be zero\n",pcVar2,"gpioSerialRead");
      }
      local_4 = 0xffffffcd;
    }
    else if (wfRx[in_EDI].mode == 1) {
      if (wfRx[in_EDI].field_4.s.readPos != wfRx[in_EDI].field_4.s.writePos) {
        local_1c = wfRx[in_EDI].field_4.s.writePos;
        if ((uint)wfRx[in_EDI].field_4.s.readPos < local_1c) {
          local_1c = local_1c - wfRx[in_EDI].field_4.s.readPos;
        }
        else {
          local_1c = wfRx[in_EDI].field_4.s.bufSize - wfRx[in_EDI].field_4.s.readPos;
        }
        if (in_RDX < local_1c) {
          local_1c = (uint)in_RDX;
        }
        local_1c = (local_1c / (uint)wfRx[in_EDI].field_4.s.bytes) * wfRx[in_EDI].field_4.s.bytes;
        if (in_RSI != (void *)0x0) {
          memcpy(in_RSI,wfRx[in_EDI].field_4.s.buf + wfRx[in_EDI].field_4.s.readPos,(ulong)local_1c)
          ;
        }
        wfRx[in_EDI].field_4.s.readPos = wfRx[in_EDI].field_4.s.readPos + local_1c;
        if (wfRx[in_EDI].field_4.s.bufSize <= (uint)wfRx[in_EDI].field_4.s.readPos) {
          wfRx[in_EDI].field_4.s.readPos = 0;
        }
      }
      local_4 = local_1c;
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar2 = myTimeStamp();
        fprintf(pFVar1,"%s %s: no serial read on gpio (%d)\n",pcVar2,"gpioSerialRead",(ulong)in_EDI)
        ;
      }
      local_4 = 0xffffffda;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: bad gpio (%d)\n",pcVar2,"gpioSerialRead",(ulong)in_EDI);
    }
    local_4 = 0xfffffffe;
  }
  return local_4;
}

Assistant:

int gpioSerialRead(unsigned gpio, void *buf, size_t bufSize)
{
   unsigned bytes=0, wpos;
   volatile wfRx_t *w;

   DBG(DBG_USER, "gpio=%d buf=%08X bufSize=%d", gpio, (int)buf, bufSize);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   if (bufSize == 0)
      SOFT_ERROR(PI_BAD_SERIAL_COUNT, "buffer size can't be zero");

   if (wfRx[gpio].mode != PI_WFRX_SERIAL)
      SOFT_ERROR(PI_NOT_SERIAL_GPIO, "no serial read on gpio (%d)", gpio);

   w = &wfRx[gpio];

   if (w->s.readPos != w->s.writePos)
   {
      wpos = w->s.writePos;

      if (wpos > w->s.readPos) bytes = wpos - w->s.readPos;
      else                     bytes = w->s.bufSize - w->s.readPos;

      if (bytes > bufSize) bytes = bufSize;

      /* copy in multiples of the data size in bytes */

      bytes = (bytes / w->s.bytes) * w->s.bytes;

      if (buf) memcpy(buf, w->s.buf+w->s.readPos, bytes);

      w->s.readPos += bytes;

      if (w->s.readPos >= w->s.bufSize) w->s.readPos = 0;
   }
   return bytes;
}